

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TgTypeParser.h
# Opt level: O2

string * __thiscall
TgBot::TgTypeParser::parse2DArray<TgBot::PhotoSize>
          (string *__return_storage_ptr__,TgTypeParser *this,
          TgTypeToJsonFunc<TgBot::PhotoSize> parseFunc,
          vector<std::vector<std::shared_ptr<TgBot::PhotoSize>,_std::allocator<std::shared_ptr<TgBot::PhotoSize>_>_>,_std::allocator<std::vector<std::shared_ptr<TgBot::PhotoSize>,_std::allocator<std::shared_ptr<TgBot::PhotoSize>_>_>_>_>
          *objects)

{
  long lVar1;
  char cVar2;
  long *in_R8;
  long lVar3;
  string local_50;
  
  if (*in_R8 == in_R8[1]) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,"",(allocator *)&local_50);
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    cVar2 = (char)__return_storage_ptr__;
    std::__cxx11::string::push_back(cVar2);
    lVar1 = in_R8[1];
    for (lVar3 = *in_R8; lVar3 != lVar1; lVar3 = lVar3 + 0x18) {
      parseArray<TgBot::PhotoSize>
                (&local_50,this,parseFunc,
                 (vector<std::shared_ptr<TgBot::PhotoSize>,_std::allocator<std::shared_ptr<TgBot::PhotoSize>_>_>
                  *)objects);
      std::__cxx11::string::append((string *)__return_storage_ptr__);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::push_back(cVar2);
    }
    std::__cxx11::string::erase
              ((ulong)__return_storage_ptr__,__return_storage_ptr__->_M_string_length - 1);
    std::__cxx11::string::push_back(cVar2);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string parse2DArray(TgTypeToJsonFunc<T> parseFunc, const std::vector<std::vector<std::shared_ptr<T>>>& objects) const {
        if (objects.empty())
            return "";
        std::string result;
        result += '[';
        for (const std::vector<std::shared_ptr<T>>& item : objects) {
            result += parseArray(parseFunc, item);
            result += ',';
        }
        result.erase(result.length() - 1);
        result += ']';
        return result;
    }